

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall FInterpolator::ClearInterpolations(FInterpolator *this)

{
  DInterpolation *pDVar1;
  DInterpolation *pDVar2;
  
  pDVar1 = GC::ReadBarrier<DInterpolation>((DInterpolation **)this);
  (this->Head).field_0.p = (DInterpolation *)0x0;
  while (pDVar1 != (DInterpolation *)0x0) {
    pDVar2 = GC::ReadBarrier<DInterpolation>((DInterpolation **)&pDVar1->Next);
    (pDVar1->Next).field_0.p = (DInterpolation *)0x0;
    (pDVar1->Prev).field_0.p = (DInterpolation *)0x0;
    (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
    pDVar1 = pDVar2;
  }
  return;
}

Assistant:

void FInterpolator::ClearInterpolations()
{
	DInterpolation *probe = Head;
	Head = NULL;
	while (probe != NULL)
	{
		DInterpolation *next = probe->Next;
		probe->Next = probe->Prev = NULL;
		probe->Destroy();
		probe = next;
	}
}